

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  state *this_00;
  uint *puVar1;
  search_accelerator *this_01;
  vector<lzham::lzcompressor::lzdecision> *this_02;
  uint *lzdec;
  short sVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  undefined8 uVar7;
  uint *puVar8;
  node_state *pnVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  bit_cost_t bVar13;
  dict_match *pdVar14;
  lzdecision *plVar15;
  uint lit_pred0;
  uint is_match_model_index;
  uint uVar16;
  lzdecision *plVar17;
  uint dict_pos;
  uint uVar18;
  long lVar19;
  uint l;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  undefined2 *puVar25;
  ulong uVar26;
  ulong uVar27;
  undefined2 uVar28;
  uint uVar29;
  uint lookahead_ofs;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  bool bVar34;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  *(undefined2 *)
   ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost + 4)
       = 0xffff;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 3) = 0;
  *(undefined4 *)
   &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  memset(&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_complexity
         ,0xff,0x2a000);
  uVar24 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  if (uVar24 != 0) {
    this_00 = &(parse_state->super_raw_parse_thread_state).m_approx_state;
    uVar18 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
    this_01 = &this->m_accel;
    lookahead_ofs =
         uVar18 - ((this->m_accel).m_lookahead_pos & (this->m_accel).m_max_dict_size_mask);
    puVar1 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
             m_match_hist;
    uVar29 = 0;
    do {
      uVar30 = uVar24 - uVar29;
      uVar21 = 0x101;
      if (uVar30 < 0x101) {
        uVar21 = uVar30;
      }
      lzdec = &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
               [(ulong)uVar29 - 1].m_total_complexity;
      uVar12 = (this->m_accel).m_cur_dict_size;
      if (uVar29 != 0) {
        uVar5 = *(undefined8 *)(lzdec + 3);
        (this_00->super_state_base).m_cur_ofs = (int)uVar5;
        (this_00->super_state_base).m_cur_state = (int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lzdec + 7);
        *(undefined8 *)puVar1 = *(undefined8 *)(lzdec + 5);
        *(undefined8 *)
         ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_match_hist +
         2) = uVar5;
        state_base::partial_advance(&this_00->super_state_base,(lzdecision *)lzdec);
      }
      lVar19 = *(long *)(lzdec + 10);
      iVar3 = lzdec[0xc];
      uVar23 = 0;
      lit_pred0 = 0;
      if (0 < (int)(uVar18 - (parse_state->super_raw_parse_thread_state).m_approx_state.
                             m_block_start_dict_ofs)) {
        lit_pred0 = (uint)(this->m_accel).m_dict.m_p[uVar18 - 1];
      }
      is_match_model_index =
           (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.m_cur_state
           << 6 | lit_pred0 >> 2;
      puVar6 = (this->m_accel).m_dict.m_p;
      uVar16 = uVar30;
      if (0x100 < uVar30) {
        uVar16 = 0x101;
      }
      uVar5 = *(undefined8 *)
               &(parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base;
      uVar32 = 1;
      lVar33 = 0;
      do {
        uVar20 = (parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                 m_match_hist[lVar33];
        uVar22 = 0;
        if ((uVar20 <= uVar12 + lookahead_ofs) && (uVar24 != uVar29)) {
          uVar22 = 0;
          do {
            if ((this->m_accel).m_dict.m_p
                [uVar22 + ((lookahead_ofs - uVar20) + (this->m_accel).m_lookahead_pos &
                          (this->m_accel).m_max_dict_size_mask)] != puVar6[uVar22 + uVar18])
            goto LAB_0010eee2;
            uVar22 = uVar22 + 1;
          } while (uVar16 + (uVar16 == 0) != (int)uVar22);
          uVar22 = (ulong)(uVar21 + (uVar21 == 0));
        }
LAB_0010eee2:
        uVar20 = (uint)uVar22;
        uVar28 = (undefined2)uVar29;
        if (uVar32 <= uVar20) {
          uVar31 = (uint)lVar33;
          state::get_rep_match_costs
                    (this_00,(uint)uVar23,lzdec_bitcosts,uVar31,uVar32,uVar20,is_match_model_index);
          uVar11 = iVar3 + 2 + uVar31;
          puVar25 = (undefined2 *)
                    ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
                            [(ulong)uVar29 + (ulong)uVar32].m_total_cost + 4);
          uVar26 = (ulong)uVar32;
          do {
            uVar27 = lzdec_bitcosts[uVar26] + lVar19;
            if ((uVar27 <= *(ulong *)(puVar25 + -6)) &&
               ((uVar27 != *(ulong *)(puVar25 + -6) ||
                (uVar11 < (uint)*(bit_cost_t *)(puVar25 + -2))))) {
              *(ulong *)(puVar25 + -6) = uVar27;
              *(uint *)(puVar25 + -2) = uVar11;
              *puVar25 = uVar28;
              *(undefined8 *)(puVar25 + -0x14) = uVar5;
              uVar4 = puVar1[1];
              uVar7 = *(undefined8 *)
                       ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                        m_match_hist + 2);
              ((state_base *)(puVar25 + -0x10))->m_cur_ofs = puVar1[0];
              ((state_base *)(puVar25 + -0x10))->m_cur_state = uVar4;
              *(undefined8 *)(puVar25 + -0xc) = uVar7;
              *(uint *)(puVar25 + -0x1a) = uVar18;
              *(int *)(puVar25 + -0x18) = (int)uVar26;
              (((node_state *)(puVar25 + -0x16))->m_lzdec).m_pos = ~uVar31;
            }
            puVar25 = puVar25 + 0x1c;
            bVar34 = uVar26 < (uVar22 & 0xffffffff);
            uVar26 = uVar26 + 1;
          } while (bVar34);
          if (uVar20 < (uint)uVar23) {
            uVar22 = uVar23;
          }
          uVar23 = uVar22 & 0xffffffff;
        }
        uVar20 = (uint)uVar23;
        lVar33 = lVar33 + 1;
        uVar32 = 2;
      } while (lVar33 != 4);
      if (uVar20 < (this->m_settings).m_fast_bytes) {
        if (1 < uVar30) {
          if ((uVar20 < 2) &&
             (uVar12 = search_accelerator::get_len2_match(this_01,lookahead_ofs), uVar12 != 0)) {
            bVar13 = state::get_len2_match_cost
                               (this_00,&this->super_CLZBase,dict_pos,uVar12,is_match_model_index);
            uVar22 = bVar13 + lVar19;
            if ((uVar22 < *(ulong *)(lzdec + 0x26)) ||
               ((uVar23 = 2, uVar22 == *(ulong *)(lzdec + 0x26) && (iVar3 + 7U < lzdec[0x28])))) {
              *(ulong *)(lzdec + 0x26) = uVar22;
              lzdec[0x28] = iVar3 + 7U;
              *(undefined2 *)(lzdec + 0x29) = uVar28;
              *(undefined8 *)(lzdec + 0x1f) = *(undefined8 *)&this_00->super_state_base;
              uVar5 = *(undefined8 *)
                       ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                        m_match_hist + 2);
              *(undefined8 *)(lzdec + 0x21) = *(undefined8 *)puVar1;
              *(undefined8 *)(lzdec + 0x23) = uVar5;
              lzdec[0x1c] = uVar18;
              lzdec[0x1d] = 2;
              lzdec[0x1e] = uVar12;
              uVar23 = 2;
            }
          }
          pdVar14 = search_accelerator::find_matches(this_01,lookahead_ofs,true);
          uVar16 = 0;
          uVar30 = (uint)uVar23;
          uVar20 = uVar30;
          if (pdVar14 != (dict_match *)0x0) {
            do {
              uVar32 = pdVar14->m_len + 2;
              if (uVar21 <= uVar32) {
                uVar32 = uVar21;
              }
              if ((uint)uVar23 < uVar32) {
                match_lens[uVar16] = uVar32;
                match_distances[uVar16] = pdVar14->m_dist & 0x7fffffff;
                uVar16 = uVar16 + 1;
                uVar23 = (ulong)uVar32;
              }
              uVar20 = (uint)uVar23;
              puVar8 = &pdVar14->m_dist;
              pdVar14 = pdVar14 + 1;
            } while (-1 < (int)*puVar8);
          }
          if (uVar16 != 0) {
            uVar30 = uVar30 + (uVar30 == 0);
            uVar12 = (this_00->super_state_base).m_cur_ofs;
            uVar31 = (this_00->super_state_base).m_cur_state;
            uVar23 = 0;
            do {
              uVar21 = uVar30 + 1;
              uVar30 = match_lens[uVar23];
              uVar4 = match_distances[uVar23];
              state::get_full_match_costs
                        (this_00,&this->super_CLZBase,uVar18,lzdec_bitcosts,uVar4,uVar21,uVar30,
                         is_match_model_index);
              for (; uVar21 <= uVar30; uVar21 = uVar21 + 1) {
                uVar22 = (ulong)uVar21;
                puVar8 = lzdec + uVar22 * 0xe;
                uVar26 = lzdec_bitcosts[uVar22] + lVar19;
                uVar32 = (uVar21 < 9) + 6 + iVar3;
                if ((uVar26 <= *(ulong *)(lzdec + uVar22 * 0xe + 10)) &&
                   ((uVar26 != *(ulong *)(lzdec + uVar22 * 0xe + 10) || (uVar32 < puVar8[0xc])))) {
                  *(ulong *)(puVar8 + 10) = uVar26;
                  puVar8[0xc] = uVar32;
                  *(undefined2 *)(puVar8 + 0xd) = uVar28;
                  (puVar8 + 3)[0] = uVar12;
                  (puVar8 + 3)[1] = uVar31;
                  uVar5 = *(undefined8 *)
                           ((parse_state->super_raw_parse_thread_state).m_approx_state.
                            super_state_base.m_match_hist + 2);
                  *(undefined8 *)(puVar8 + 5) = *(undefined8 *)puVar1;
                  *(undefined8 *)(puVar8 + 7) = uVar5;
                  *puVar8 = uVar18;
                  puVar8[1] = uVar21;
                  puVar8[2] = uVar4;
                }
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar16);
          }
        }
        if (uVar20 < (this->m_settings).m_fast_bytes) {
          bVar13 = state::get_lit_cost(this_00,this_01,uVar18,lit_pred0,is_match_model_index);
          uVar23 = bVar13 + lVar19;
          if ((uVar23 < *(ulong *)(lzdec + 0x18)) ||
             ((uVar20 = 1, uVar23 == *(ulong *)(lzdec + 0x18) &&
              (uVar20 = 1, iVar3 + 1U < lzdec[0x1a])))) {
            *(ulong *)(lzdec + 0x18) = uVar23;
            lzdec[0x1a] = iVar3 + 1U;
            *(undefined2 *)(lzdec + 0x1b) = uVar28;
            *(undefined8 *)(lzdec + 0x11) = *(undefined8 *)&this_00->super_state_base;
            uVar5 = *(undefined8 *)
                     ((parse_state->super_raw_parse_thread_state).m_approx_state.super_state_base.
                      m_match_hist + 2);
            *(undefined8 *)(lzdec + 0x13) = *(undefined8 *)puVar1;
            *(undefined8 *)(lzdec + 0x15) = uVar5;
            lzdec[0xe] = uVar18;
            *(undefined8 *)(lzdec + 0xf) = 0;
            uVar20 = 1;
          }
        }
      }
      uVar18 = uVar18 + uVar20;
      lookahead_ofs = lookahead_ofs + uVar20;
      uVar29 = uVar29 + uVar20;
    } while (uVar29 < uVar24);
  }
  this_02 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  bVar34 = elemental_vector::increase_capacity
                     ((elemental_vector *)this_02,uVar24,true,0xc,
                      vector<lzham::lzcompressor::lzdecision>::object_mover,true);
  if (bVar34) {
    plVar15 = this_02->m_p;
    plVar17 = plVar15;
    do {
      lVar19 = (long)(int)uVar24;
      plVar17->m_dist =
           (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[lVar19].m_lzdec.
           m_pos;
      pnVar9 = (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states + lVar19 + -1;
      uVar5._0_4_ = pnVar9->m_total_complexity;
      uVar5._4_2_ = pnVar9->m_parent_index;
      uVar5._6_1_ = pnVar9->m_parent_state_index;
      uVar5._7_1_ = pnVar9->field_0x37;
      plVar17->m_pos = (undefined4)uVar5;
      plVar17->m_len = (int)((ulong)uVar5 >> 0x20);
      plVar17 = plVar17 + 1;
      sVar2 = *(short *)((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states
                                [lVar19].m_total_cost + 4);
      uVar24 = (uint)sVar2;
      plVar15 = plVar15 + 1;
    } while (0 < sVar2);
    uVar18 = (int)((ulong)((long)plVar15 -
                          (long)(parse_state->super_raw_parse_thread_state).m_best_decisions.m_p) >>
                  2) * -0x55555555;
    uVar24 = (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size;
    if ((uVar24 != uVar18) &&
       (((uVar18 < uVar24 ||
         (uVar18 <= (parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity)) ||
        (bVar10 = elemental_vector::increase_capacity
                            ((elemental_vector *)this_02,uVar18,uVar24 + 1 == uVar18,0xc,
                             vector<lzham::lzcompressor::lzdecision>::object_mover,true), bVar10))))
    {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = uVar18;
    }
  }
  else {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  return bVar34;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#if 0
      for (uint i = 1; i <= cMaxParseGraphNodes; i++)
      {
         pNodes[i].clear();
      }
#else
      memset( &pNodes[1], 0xFF, cMaxParseGraphNodes * sizeof(node_state));
#endif

      state &approx_state = parse_state.m_approx_state;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         const uint max_admissable_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;
               }
            }

            match_hist_min_match_len = cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len); //match_hist_max_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_settings.m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_to_parse))
      {
         parse_state.m_failed = true;
         return false;
      }

      int node_index = bytes_to_parse;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      return true;
   }